

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RelationsAnalyzer.cpp
# Opt level: O1

Shift __thiscall
dg::vr::RelationsAnalyzer::getShift
          (RelationsAnalyzer *this,
          vector<const_dg::vr::VRLocation_*,_std::allocator<const_dg::vr::VRLocation_*>_>
          *changeLocations,VectorSet<const_llvm::Value_*> *froms)

{
  long lVar1;
  Shift SVar2;
  __normal_iterator<const_llvm::Value_*const_*,_std::vector<const_llvm::Value_*,_std::allocator<const_llvm::Value_*>_>_>
  _Var3;
  Shift SVar4;
  pointer ppVVar5;
  bool bVar6;
  undefined8 local_38;
  
  ppVVar5 = (changeLocations->
            super__Vector_base<const_dg::vr::VRLocation_*,_std::allocator<const_dg::vr::VRLocation_*>_>
            )._M_impl.super__Vector_impl_data._M_start;
  SVar4 = EQ;
  do {
    ppVVar5 = ppVVar5 + 1;
    if (ppVVar5 ==
        (changeLocations->
        super__Vector_base<const_dg::vr::VRLocation_*,_std::allocator<const_dg::vr::VRLocation_*>_>)
        ._M_impl.super__Vector_impl_data._M_finish) {
      return SVar4;
    }
    lVar1 = *(long *)((long)((*((*ppVVar5)->predecessors).
                               super__Vector_base<dg::vr::VREdge_*,_std::allocator<dg::vr::VREdge_*>_>
                               ._M_impl.super__Vector_impl_data._M_start)->op)._M_t.
                            super___uniq_ptr_impl<dg::vr::VROp,_std::default_delete<dg::vr::VROp>_>.
                            _M_t + 0x10);
    local_38 = *(undefined8 *)(lVar1 + -0x20);
    _Var3 = std::
            __find_if<__gnu_cxx::__normal_iterator<llvm::Value_const*const*,std::vector<llvm::Value_const*,std::allocator<llvm::Value_const*>>>,__gnu_cxx::__ops::_Iter_equals_val<llvm::Value_const*const>>
                      ((froms->vec).
                       super__Vector_base<const_llvm::Value_*,_std::allocator<const_llvm::Value_*>_>
                       ._M_impl.super__Vector_impl_data._M_start,
                       (froms->vec).
                       super__Vector_base<const_llvm::Value_*,_std::allocator<const_llvm::Value_*>_>
                       ._M_impl.super__Vector_impl_data._M_finish,&local_38);
    if ((_Var3._M_current ==
         (froms->vec).super__Vector_base<const_llvm::Value_*,_std::allocator<const_llvm::Value_*>_>.
         _M_impl.super__Vector_impl_data._M_finish) ||
       ((SVar2 = getShift(*(Value **)(lVar1 + -0x40),froms), SVar4 != EQ &&
        ((SVar4 == UNKNOWN || (bVar6 = SVar4 != SVar2, SVar2 = SVar4, bVar6)))))) {
      bVar6 = false;
    }
    else {
      bVar6 = true;
      SVar4 = SVar2;
    }
  } while (bVar6);
  return UNKNOWN;
}

Assistant:

RelationsAnalyzer::Shift RelationsAnalyzer::getShift(
        const std::vector<const VRLocation *> &changeLocations,
        const VectorSet<V> &froms) const {
    Shift shift = Shift::EQ;
    // first location is the tree predecessor
    for (auto it = std::next(changeLocations.begin());
         it != changeLocations.end(); ++it) {
        const VRLocation *loc = *it;
        assert(loc->predsSize() == 1);

        V inst = static_cast<VRInstruction *>(loc->getPredEdge(0)->op.get())
                         ->getInstruction();
        assert(inst);
        assert(llvm::isa<llvm::StoreInst>(inst));
        const llvm::StoreInst *store = llvm::cast<llvm::StoreInst>(inst);
        if (!froms.contains(store->getPointerOperand()))
            return Shift::UNKNOWN;

        const auto *what = store->getValueOperand();

        Shift current = getShift(what, froms);

        if (shift == Shift::UNKNOWN)
            return shift;
        if (shift == Shift::EQ)
            shift = current;
        else if (shift != current)
            return Shift::UNKNOWN;
    }
    return shift;
}